

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

bool __thiscall
TgBot::Api::restrictChatMember
          (Api *this,int64_t chatId,int32_t userId,uint64_t untilDate,bool canSendMessages,
          bool canSendMediaMessages,bool canSendOtherMessages,bool canAddWebPagePreviews)

{
  type_conflict tVar1;
  bool local_da [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  allocator local_a1;
  string local_a0;
  ptree local_80;
  undefined1 local_48 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  bool canAddWebPagePreviews_local;
  bool canSendOtherMessages_local;
  bool canSendMediaMessages_local;
  uint64_t uStack_28;
  bool canSendMessages_local;
  uint64_t untilDate_local;
  int64_t iStack_18;
  int32_t userId_local;
  int64_t chatId_local;
  Api *this_local;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = canSendOtherMessages;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = canAddWebPagePreviews;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = canSendMediaMessages;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = canSendMessages;
  uStack_28 = untilDate;
  untilDate_local._4_4_ = userId;
  iStack_18 = chatId;
  chatId_local = (int64_t)this;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48,7);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
             (char (*) [8])0x4758d6,&stack0xffffffffffffffe8);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
             (char (*) [8])"user_id",(int *)((long)&untilDate_local + 4));
  if (uStack_28 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],unsigned_long&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [11])"until_date",&stack0xffffffffffffffd8);
  }
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[18],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [18])"can_send_messages",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[24],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [24])"can_send_media_messages",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  }
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[24],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [24])"can_send_other_messages",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  }
  if ((args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_1_ & 1) != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[26],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [26])"can_add_web_page_previews",
               (bool *)((long)&args.
                               super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"restrictChatMember",&local_a1);
  sendRequest(&local_80,this,&local_a0,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_d8,"",0x2e);
  local_da[0] = false;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(&local_80,&local_d8,local_da);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_d8);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  return tVar1;
}

Assistant:

bool Api::restrictChatMember(int64_t chatId, int32_t userId, uint64_t untilDate, bool canSendMessages,
                             bool canSendMediaMessages, bool canSendOtherMessages, bool canAddWebPagePreviews) const {
    vector<HttpReqArg> args;
    args.reserve(7);
    args.emplace_back("chat_id", chatId);
    args.emplace_back("user_id", userId);
    if (untilDate) {
        args.emplace_back("until_date", untilDate);
    }
    if (canSendMessages) {
        args.emplace_back("can_send_messages", canSendMessages);
    }
    if (canSendMediaMessages) {
        args.emplace_back("can_send_media_messages", canSendMediaMessages);
    }
    if (canSendOtherMessages) {
        args.emplace_back("can_send_other_messages", canSendOtherMessages);
    }
    if (canAddWebPagePreviews) {
        args.emplace_back("can_add_web_page_previews", canAddWebPagePreviews);
    }
    return sendRequest("restrictChatMember", args).get<bool>("", false);
}